

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::write(arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  basic_format_specs<char> *in_R8;
  basic_string_view<char> s;
  
  if (this->specs_ == (format_specs *)0x0) {
    pcVar1 = "false";
    if ((char)__fd != '\0') {
      pcVar1 = "true";
    }
    bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (pcVar1,pcVar1 + ((ulong)(uint)__fd & 0xff ^ 5),(this->out_).container);
  }
  else {
    pcVar1 = "false";
    if ((char)__fd != '\0') {
      pcVar1 = "true";
    }
    s.data_ = (char *)((ulong)(uint)__fd & 0xff ^ 5);
    s.size_ = (size_t)this->specs_;
    bVar2 = write<char,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      ((this->out_).container,
                       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)pcVar1,s,in_R8);
  }
  (this->out_).container = bVar2.container;
  return (ssize_t)bVar2.container;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }